

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.h
# Opt level: O2

void __thiscall bsplib::Rdma::ActionBuf::clear(ActionBuf *this)

{
  pointer pAVar1;
  pointer puVar2;
  pointer puVar3;
  
  this->m_dummy_bsmp = 0;
  pAVar1 = (this->m_actions).
           super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_actions).
      super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar1) {
    (this->m_actions).
    super__Vector_base<bsplib::Rdma::Action,_std::allocator<bsplib::Rdma::Action>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  puVar2 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_counts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    *puVar3 = 0;
  }
  puVar2 = (this->m_get_buffer_offset).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_get_buffer_offset).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    *puVar3 = 0;
  }
  return;
}

Assistant:

void clear() 
        {
            m_dummy_bsmp = false;
            m_actions.clear();
            std::fill( m_counts.begin(), m_counts.end(), 0);
            std::fill( m_get_buffer_offset.begin(), m_get_buffer_offset.end(), 0);
        }